

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O1

void __thiscall
kratos::PackedStruct::PackedStruct
          (PackedStruct *this,string *struct_name,
          vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
          *attributes)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  size_type *psVar3;
  pointer pcVar4;
  undefined4 *puVar5;
  undefined8 uVar6;
  undefined4 *puVar7;
  undefined1 auStack_78 [8];
  PackedStructFieldDef def;
  
  paVar1 = &(this->struct_name).field_2;
  (this->struct_name)._M_dataplus._M_p = (pointer)paVar1;
  pcVar4 = (struct_name->_M_dataplus)._M_p;
  paVar2 = &struct_name->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar4 == paVar2) {
    uVar6 = *(undefined8 *)((long)&struct_name->field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->struct_name).field_2 + 8) = uVar6;
  }
  else {
    (this->struct_name)._M_dataplus._M_p = pcVar4;
    (this->struct_name).field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->struct_name)._M_string_length = struct_name->_M_string_length;
  (struct_name->_M_dataplus)._M_p = (pointer)paVar2;
  struct_name->_M_string_length = 0;
  (struct_name->field_2)._M_local_buf[0] = '\0';
  *(undefined8 *)
   ((long)&(this->attributes).
           super__Vector_base<kratos::PackedStructFieldDef,_std::allocator<kratos::PackedStructFieldDef>_>
           ._M_impl.super__Vector_impl_data._M_finish + 1) = 0;
  *(undefined8 *)
   ((long)&(this->attributes).
           super__Vector_base<kratos::PackedStructFieldDef,_std::allocator<kratos::PackedStructFieldDef>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 1) = 0;
  (this->attributes).
  super__Vector_base<kratos::PackedStructFieldDef,_std::allocator<kratos::PackedStructFieldDef>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->attributes).
  super__Vector_base<kratos::PackedStructFieldDef,_std::allocator<kratos::PackedStructFieldDef>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  puVar7 = *(undefined4 **)attributes;
  puVar5 = *(undefined4 **)(attributes + 8);
  if (puVar7 != puVar5) {
    def.struct_ = (PackedStruct *)&this->attributes;
    psVar3 = &def.name._M_string_length;
    do {
      def.name.field_2._M_allocated_capacity = 0;
      def.width = 0;
      def.signed_ = false;
      def._37_3_ = 0;
      def.name._M_dataplus._M_p = (pointer)0x0;
      def.name._M_string_length = 0;
      def.name.field_2._8_8_ = 0;
      auStack_78 = (undefined1  [8])psVar3;
      std::__cxx11::string::_M_assign((string *)auStack_78);
      def.name.field_2._8_4_ = *puVar7;
      std::vector<kratos::PackedStructFieldDef,std::allocator<kratos::PackedStructFieldDef>>::
      emplace_back<kratos::PackedStructFieldDef&>
                ((vector<kratos::PackedStructFieldDef,std::allocator<kratos::PackedStructFieldDef>>
                  *)def.struct_,(PackedStructFieldDef *)auStack_78);
      if (auStack_78 != (undefined1  [8])psVar3) {
        operator_delete((void *)auStack_78,def.name._M_string_length + 1);
      }
      puVar7 = puVar7 + 10;
    } while (puVar7 != puVar5);
  }
  return;
}

Assistant:

PackedStruct::PackedStruct(std::string struct_name,
                           const std::vector<std::tuple<std::string, uint32_t>> &attributes)
    : struct_name(std::move(struct_name)) {
    for (auto const &[name, size] : attributes) {
        auto def = PackedStructFieldDef();
        def.signed_ = false;
        def.name = name;
        def.width = size;
        this->attributes.emplace_back(def);
    }
}